

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

Pln_Man_t * Pln_ManAlloc(Gia_Man_t *pGia,Vec_Int_t *vOrder)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  Pln_Man_t *pPVar5;
  Hsh_VecMan_t *p;
  Hsh_VecMan_t *p_00;
  Vec_Que_t *pVVar6;
  int *piVar7;
  Vec_Flt_t *pVVar8;
  float *pfVar9;
  Vec_Int_t *p_01;
  Vec_Int_t *vVec;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  size_t __size;
  long lVar13;
  int iVar14;
  float **ppfVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar14 = 1;
  pPVar5 = (Pln_Man_t *)calloc(1,0x70);
  pPVar5->pGia = pGia;
  p = Hsh_VecManStart(iVar14);
  pPVar5->pHashC = p;
  p_00 = Hsh_VecManStart(iVar14);
  pPVar5->pHashM = p_00;
  pVVar6 = (Vec_Que_t *)calloc(1,0x20);
  pVVar6->nCap = 0x3e9;
  pVVar6->nSize = 1;
  piVar7 = (int *)malloc(0xfa4);
  memset(piVar7,0xff,0xfa4);
  pVVar6->pHeap = piVar7;
  piVar7 = (int *)malloc(0xfa4);
  memset(piVar7,0xff,0xfa4);
  pVVar6->pOrder = piVar7;
  pPVar5->vQue = pVVar6;
  pVVar8 = (Vec_Flt_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pfVar9 = (float *)malloc(4000);
  pVVar8->pArray = pfVar9;
  pPVar5->vCounts = pVVar8;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar7 = (int *)malloc(4000);
  p_01->pArray = piVar7;
  pPVar5->vCoefs = p_01;
  vVec = (Vec_Int_t *)malloc(0x10);
  vVec->nCap = 100;
  vVec->nSize = 0;
  piVar7 = (int *)malloc(400);
  vVec->pArray = piVar7;
  pPVar5->vTempC[0] = vVec;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar10->pArray = piVar7;
  pPVar5->vTempC[1] = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar10->pArray = piVar7;
  pPVar5->vTempM[0] = pVVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  pPVar5->vTempM[1] = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  pPVar5->vTempM[2] = pVVar11;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar11->pArray = piVar7;
  pPVar5->vTempM[3] = pVVar11;
  if (vOrder == (Vec_Int_t *)0x0) {
    uVar2 = pGia->nObjs;
    pVVar11 = (Vec_Int_t *)malloc(0x10);
    uVar4 = 0x10;
    if (0xe < uVar2 - 1) {
      uVar4 = uVar2;
    }
    pVVar11->nCap = uVar4;
    if (uVar4 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)(int)uVar4 << 2);
    }
    pVVar11->pArray = piVar7;
    pVVar11->nSize = uVar2;
    auVar3 = _DAT_0094e250;
    if (0 < (int)uVar2) {
      lVar13 = (ulong)uVar2 - 1;
      auVar16._8_4_ = (int)lVar13;
      auVar16._0_8_ = lVar13;
      auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar12 = 0;
      auVar16 = auVar16 ^ _DAT_0094e250;
      auVar17 = _DAT_0094e240;
      do {
        auVar18 = auVar17 ^ auVar3;
        if ((bool)(~(auVar18._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar18._0_4_ ||
                    auVar16._4_4_ < auVar18._4_4_) & 1)) {
          piVar7[uVar12] = (int)uVar12;
        }
        if ((auVar18._12_4_ != auVar16._12_4_ || auVar18._8_4_ <= auVar16._8_4_) &&
            auVar18._12_4_ <= auVar16._12_4_) {
          piVar7[uVar12 + 1] = (int)uVar12 + 1;
        }
        uVar12 = uVar12 + 2;
        lVar13 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar13 + 2;
      } while ((uVar2 + 1 & 0xfffffffe) != uVar12);
    }
    pPVar5->vOrder = pVVar11;
  }
  else {
    pVVar11 = (Vec_Int_t *)malloc(0x10);
    iVar14 = vOrder->nSize;
    pVVar11->nSize = iVar14;
    pVVar11->nCap = iVar14;
    if ((long)iVar14 == 0) {
      __size = 0;
      piVar7 = (int *)0x0;
    }
    else {
      __size = (long)iVar14 * 4;
      piVar7 = (int *)malloc(__size);
    }
    pVVar11->pArray = piVar7;
    memcpy(piVar7,vOrder->pArray,__size);
    iVar1 = pGia->nObjs;
    pPVar5->vOrder = pVVar11;
    if (iVar14 != iVar1) {
      __assert_fail("Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                    ,0x5c,"Pln_Man_t *Pln_ManAlloc(Gia_Man_t *, Vec_Int_t *)");
    }
  }
  ppfVar15 = &pVVar8->pArray;
  pVVar6->pCostsFlt = ppfVar15;
  Hsh_VecManAdd(p,vVec);
  Hsh_VecManAdd(p_00,pVVar10);
  uVar2 = pVVar8->nSize;
  if (uVar2 == pVVar8->nCap) {
    if ((int)uVar2 < 0x10) {
      if (*ppfVar15 == (float *)0x0) {
        pfVar9 = (float *)malloc(0x40);
      }
      else {
        pfVar9 = (float *)realloc(*ppfVar15,0x40);
      }
      pVVar8->pArray = pfVar9;
      pVVar8->nCap = 0x10;
    }
    else {
      if (*ppfVar15 == (float *)0x0) {
        pfVar9 = (float *)malloc((ulong)uVar2 << 3);
      }
      else {
        pfVar9 = (float *)realloc(*ppfVar15,(ulong)uVar2 << 3);
      }
      pVVar8->pArray = pfVar9;
      pVVar8->nCap = uVar2 * 2;
    }
  }
  else {
    pfVar9 = *ppfVar15;
  }
  iVar14 = pVVar8->nSize;
  pVVar8->nSize = iVar14 + 1;
  pfVar9[iVar14] = 0.0;
  Vec_IntPush(p_01,0);
  return pPVar5;
}

Assistant:

Pln_Man_t * Pln_ManAlloc( Gia_Man_t * pGia, Vec_Int_t * vOrder )
{
    Pln_Man_t * p = ABC_CALLOC( Pln_Man_t, 1 );
    p->pGia      = pGia;
    p->pHashC    = Hsh_VecManStart( 1000 );
    p->pHashM    = Hsh_VecManStart( 1000 );
    p->vQue      = Vec_QueAlloc( 1000 );
    p->vCounts   = Vec_FltAlloc( 1000 );
    p->vCoefs    = Vec_IntAlloc( 1000 );
    p->vTempC[0] = Vec_IntAlloc( 100 );
    p->vTempC[1] = Vec_IntAlloc( 100 );
    p->vTempM[0] = Vec_IntAlloc( 100 );
    p->vTempM[1] = Vec_IntAlloc( 100 );
    p->vTempM[2] = Vec_IntAlloc( 100 );
    p->vTempM[3] = Vec_IntAlloc( 100 );
    p->vOrder    = vOrder ? Vec_IntDup(vOrder) : Vec_IntStartNatural( Gia_ManObjNum(pGia) );
    assert( Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // add 0-constant and 1-monomial
    Hsh_VecManAdd( p->pHashC, p->vTempC[0] );
    Hsh_VecManAdd( p->pHashM, p->vTempM[0] );
    Vec_FltPush( p->vCounts, 0 );
    Vec_IntPush( p->vCoefs, 0 );
    return p;
}